

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O0

int Psr_ManReadSignalList(Psr_Man_t *p,Vec_Int_t *vTemp,char LastSymb,int fAddForm)

{
  int iVar1;
  int Item;
  int fAddForm_local;
  char LastSymb_local;
  Vec_Int_t *vTemp_local;
  Psr_Man_t *p_local;
  
  Vec_IntClear(vTemp);
  while( true ) {
    iVar1 = Psr_ManReadSignal(p);
    if (iVar1 == 0) {
      iVar1 = Psr_ManErrorSet(p,"Cannot read signal in the list.",0);
      return iVar1;
    }
    if (fAddForm != 0) {
      Vec_IntPush(vTemp,0);
    }
    Vec_IntPush(vTemp,iVar1);
    iVar1 = Psr_ManIsChar(p,LastSymb);
    if (iVar1 != 0) break;
    iVar1 = Psr_ManIsChar(p,',');
    if (iVar1 == 0) {
      iVar1 = Psr_ManErrorSet(p,"Expecting comma in the list.",0);
      return iVar1;
    }
    p->pCur = p->pCur + 1;
  }
  return 1;
}

Assistant:

int Psr_ManReadSignalList( Psr_Man_t * p, Vec_Int_t * vTemp, char LastSymb, int fAddForm )
{
    Vec_IntClear( vTemp );
    while ( 1 )
    {
        int Item = Psr_ManReadSignal(p);
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Cannot read signal in the list.", 0);
        if ( fAddForm )
            Vec_IntPush( vTemp, 0 );
        Vec_IntPush( vTemp, Item );
        if ( Psr_ManIsChar(p, LastSymb) )   break;
        if ( !Psr_ManIsChar(p, ',') )       return Psr_ManErrorSet(p, "Expecting comma in the list.", 0);
        p->pCur++;
    }
    return 1;
}